

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::~ShortcutsWindow(ShortcutsWindow *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ShortcutsWindow_001a72f0;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ShortcutsWindow_001a74c8;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ShortcutsWindow_001a74f8;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__ShortcutsWindow_001a7520;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__ShortcutsWindow_001a7548;
  pcVar2 = (this->originalKey)._M_dataplus._M_p;
  paVar1 = &(this->originalKey).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->activeKey)._M_dataplus._M_p;
  paVar1 = &(this->activeKey).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ::~vector(&this->entries);
  p_Var3 = (this->changedCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->changedCallback,(_Any_data *)&this->changedCallback,
              __destroy_functor);
  }
  Window::~Window(&this->super_Window);
  return;
}

Assistant:

ShortcutsWindow::~ShortcutsWindow() {
}